

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_tibor_maps.hpp
# Opt level: O2

void __thiscall PatchOptimizeTiborMaps::alter_world(PatchOptimizeTiborMaps *this,World *world)

{
  Map *pMVar1;
  
  pMVar1 = World::map(world,0x328);
  Map::remove_entity(pMVar1,'\x05',true);
  pMVar1 = World::map(world,0x32b);
  Map::remove_entity(pMVar1,'\x04',true);
  pMVar1 = World::map(world,0x32c);
  Map::remove_entity(pMVar1,'\x02',true);
  pMVar1 = World::map(world,0x32f);
  Map::remove_entity(pMVar1,'\x03',true);
  return;
}

Assistant:

void alter_world(World& world) override
    {
        // Remove a few ghosts from laggy Tibor maps
        world.map(MAP_TIBOR_808)->remove_entity(5);

        world.map(MAP_TIBOR_811)->remove_entity(4);

        world.map(MAP_TIBOR_812)->remove_entity(2);

        world.map(MAP_TIBOR_815)->remove_entity(3);
    }